

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O0

CExtPubKey * __thiscall CExtKey::Neuter(CExtKey *this)

{
  long lVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  uchar *in_RSI;
  CExtPubKey *in_RDI;
  long in_FS_OFFSET;
  CExtPubKey *ret;
  CExtPubKey *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  undefined7 uStack_48;
  undefined8 uStack_41;
  undefined8 local_39;
  undefined8 uStack_31;
  undefined4 local_29;
  undefined4 uStack_25;
  undefined4 uStack_21;
  undefined4 uStack_1d;
  undefined4 local_19;
  undefined4 uStack_15;
  undefined4 uStack_11;
  undefined4 uStack_d;
  uchar local_9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CExtPubKey::CExtPubKey(in_stack_ffffffffffffff88);
  in_RDI->nDepth = *in_RSI;
  *(undefined4 *)in_RDI->vchFingerprint = *(undefined4 *)(in_RSI + 1);
  in_RDI->nChild = *(uint *)(in_RSI + 8);
  CKey::GetPubKey((CKey *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  (in_RDI->pubkey).vch[0x40] = local_9;
  *(undefined4 *)((in_RDI->pubkey).vch + 0x30) = local_19;
  *(undefined4 *)((in_RDI->pubkey).vch + 0x34) = uStack_15;
  *(undefined4 *)((in_RDI->pubkey).vch + 0x38) = uStack_11;
  *(undefined4 *)((in_RDI->pubkey).vch + 0x3c) = uStack_d;
  *(undefined4 *)((in_RDI->pubkey).vch + 0x20) = local_29;
  *(undefined4 *)((in_RDI->pubkey).vch + 0x24) = uStack_25;
  *(undefined4 *)((in_RDI->pubkey).vch + 0x28) = uStack_21;
  *(undefined4 *)((in_RDI->pubkey).vch + 0x2c) = uStack_1d;
  *(undefined8 *)((in_RDI->pubkey).vch + 0x10) = local_39;
  *(undefined8 *)((in_RDI->pubkey).vch + 0x18) = uStack_31;
  *(ulong *)(in_RDI->pubkey).vch = CONCAT71(uStack_48,in_stack_ffffffffffffffb7);
  *(undefined8 *)((in_RDI->pubkey).vch + 8) = uStack_41;
  uVar2 = *(undefined4 *)(in_RSI + 0xc);
  uVar3 = *(undefined4 *)(in_RSI + 0x10);
  uVar4 = *(undefined4 *)(in_RSI + 0x14);
  uVar5 = *(undefined4 *)(in_RSI + 0x18);
  uVar6 = *(undefined4 *)(in_RSI + 0x20);
  uVar7 = *(undefined4 *)(in_RSI + 0x24);
  uVar8 = *(undefined4 *)(in_RSI + 0x28);
  *(undefined4 *)((in_RDI->chaincode).super_base_blob<256U>.m_data._M_elems + 0x10) =
       *(undefined4 *)(in_RSI + 0x1c);
  *(undefined4 *)((in_RDI->chaincode).super_base_blob<256U>.m_data._M_elems + 0x14) = uVar6;
  *(undefined4 *)((in_RDI->chaincode).super_base_blob<256U>.m_data._M_elems + 0x18) = uVar7;
  *(undefined4 *)((in_RDI->chaincode).super_base_blob<256U>.m_data._M_elems + 0x1c) = uVar8;
  *(undefined4 *)(in_RDI->chaincode).super_base_blob<256U>.m_data._M_elems = uVar2;
  *(undefined4 *)((in_RDI->chaincode).super_base_blob<256U>.m_data._M_elems + 4) = uVar3;
  *(undefined4 *)((in_RDI->chaincode).super_base_blob<256U>.m_data._M_elems + 8) = uVar4;
  *(undefined4 *)((in_RDI->chaincode).super_base_blob<256U>.m_data._M_elems + 0xc) = uVar5;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

CExtPubKey CExtKey::Neuter() const {
    CExtPubKey ret;
    ret.nDepth = nDepth;
    memcpy(ret.vchFingerprint, vchFingerprint, 4);
    ret.nChild = nChild;
    ret.pubkey = key.GetPubKey();
    ret.chaincode = chaincode;
    return ret;
}